

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O1

int fprintHTML(FILE *f,SXML_CHAR *str)

{
  char cVar1;
  long lVar2;
  char cVar3;
  _html_special_dict *p_Var4;
  long lVar5;
  int iVar6;
  bool bVar7;
  
  cVar3 = *str;
  if (cVar3 == '\0') {
    iVar6 = 0;
  }
  else {
    iVar6 = 0;
    do {
      if (cVar3 == '<') {
        bVar7 = false;
        p_Var4 = HTML_SPECIAL_DICT;
      }
      else {
        lVar2 = 0;
        do {
          lVar5 = lVar2;
          cVar1 = (&HTML_SPECIAL_DICT[1].chr)[lVar5];
          if (lVar5 + 0x18 == 0x78) {
            bVar7 = cVar1 == '\0';
            goto LAB_001066c7;
          }
          lVar2 = lVar5 + 0x18;
        } while (cVar3 != cVar1);
        bVar7 = cVar1 == '\0';
        p_Var4 = (_html_special_dict *)(lVar5 + 0x10ad38);
      }
      if (f != (FILE *)0x0) {
        fputs(p_Var4->html,(FILE *)f);
      }
      iVar6 = iVar6 + p_Var4->html_len;
LAB_001066c7:
      if (bVar7) {
        if (f != (FILE *)0x0) {
          fputc((int)*str,(FILE *)f);
        }
        iVar6 = iVar6 + 1;
      }
      cVar3 = str[1];
      str = str + 1;
    } while (cVar3 != '\0');
  }
  return iVar6;
}

Assistant:

int fprintHTML(FILE* f, SXML_CHAR* str)
{
	SXML_CHAR* p;
	int i, n;
	
	for (p = str, n = 0; *p != NULC; p++) {
		for (i = 0; HTML_SPECIAL_DICT[i].chr; i++) {
			if (*p != HTML_SPECIAL_DICT[i].chr)
				continue;
			if (f != NULL)
				sx_fputs(HTML_SPECIAL_DICT[i].html, f);
			n += HTML_SPECIAL_DICT[i].html_len;
			break;
		}
		if (HTML_SPECIAL_DICT[i].chr == NULC) {
			if (f != NULL)
				(void)sx_fputc(*p, f);
			n++;
		}
	}
	
	return n;
}